

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronMat.cpp
# Opt level: O0

void __thiscall NeuronMat::resetOp(NeuronMat *this)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 8) != 0) {
    Op::reset(*(Op **)(in_RDI + 8));
  }
  if (*(long *)(in_RDI + 0x10) != 0) {
    Op::reset(*(Op **)(in_RDI + 0x10));
  }
  if (*(long *)(in_RDI + 0x18) != 0) {
    Op::reset(*(Op **)(in_RDI + 0x18));
  }
  return;
}

Assistant:

void NeuronMat::resetOp() {
    if (op != nullptr)
        op->reset();
    if (op_update != nullptr)
        op_update->reset();
    if (op_reveal != nullptr)
        op_reveal->reset();
}